

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

int __thiscall tinyusdz::AttrMetas::get_unauthoredValuesIndex(AttrMetas *this)

{
  bool bVar1;
  mapped_type *this_00;
  int local_48;
  allocator local_41;
  int v;
  mapped_type *local_20;
  MetaVariable *mv;
  AttrMetas *this_local;
  
  mv = (MetaVariable *)this;
  bVar1 = has_unauthoredValuesIndex(this);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&v,"unauthoredValuesIndex",&local_41);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
              ::at(&this->meta,(key_type *)&v);
    std::__cxx11::string::~string((string *)&v);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    local_20 = this_00;
    bVar1 = MetaVariable::get_value<int>(this_00,&local_48);
    if (bVar1) {
      this_local._4_4_ = local_48;
    }
    else {
      this_local._4_4_ = -1;
    }
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int AttrMetas::get_unauthoredValuesIndex() const {
  if (!has_unauthoredValuesIndex()) {
    return -1;
  }

  const MetaVariable &mv = meta.at("unauthoredValuesIndex");
  int v;
  if (mv.get_value<int>(&v)) {
    return v;
  }

  return -1;
}